

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O3

void __thiscall nuraft::raft_server::send_reconnect_request(raft_server *this)

{
  int32 iVar1;
  __int_type_conflict _Var2;
  element_type *peVar3;
  peer *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  long *plVar4;
  __int_type _Var5;
  int iVar6;
  iterator iVar7;
  bool bVar8;
  ptr<req_msg> req;
  unique_lock<std::recursive_mutex> guard;
  string local_70;
  ptr<req_msg> local_50;
  ptr<peer> local_40;
  unique_lock<std::recursive_mutex> local_30;
  
  local_30._M_device = &this->lock_;
  local_30._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_30);
  local_30._M_owns = true;
  if ((this->leader_).super___atomic_base<int>._M_i == this->id_) {
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar3 != (element_type *)0x0) && (iVar6 = (*peVar3->_vptr_logger[7])(), 1 < iVar6)) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_70,"this node %d is leader, cannot send reconnect request",
                 (ulong)(uint)this->id_);
      (*peVar3->_vptr_logger[8])
                (peVar3,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"send_reconnect_request",0x382,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_70._M_dataplus._M_p._4_4_,(__int_type_conflict)local_70._M_dataplus._M_p
                     ) != &local_70.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_70._M_dataplus._M_p._4_4_,
                                 (__int_type_conflict)local_70._M_dataplus._M_p));
      }
    }
  }
  else {
    local_70._M_dataplus._M_p._0_4_ = (this->leader_).super___atomic_base<int>._M_i;
    iVar7 = std::
            _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->peers_)._M_h,(key_type_conflict *)&local_70);
    if (iVar7.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar3 != (element_type *)0x0) && (iVar6 = (*peVar3->_vptr_logger[7])(), 0 < iVar6)) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_(&local_70,"cannot find leader!");
        (*peVar3->_vptr_logger[8])
                  (peVar3,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"send_reconnect_request",0x399,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_70._M_dataplus._M_p._4_4_,
                        (__int_type_conflict)local_70._M_dataplus._M_p) != &local_70.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_70._M_dataplus._M_p._4_4_,
                                   (__int_type_conflict)local_70._M_dataplus._M_p));
        }
      }
      plVar4 = *(long **)&(((this->ctx_)._M_t.
                            super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                            .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->
                          state_mgr_).
                          super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
      (**(code **)(*plVar4 + 0x40))(plVar4,0xffffffea);
    }
    else {
      this_00 = *(peer **)((long)iVar7.
                                 super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                                 ._M_cur + 0x10);
      this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)iVar7.
                        super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                        ._M_cur + 0x18);
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      _Var5 = (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i;
      local_50.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_50.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
      (local_50.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = 1;
      (local_50.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count = 1;
      (local_50.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_005c44f0;
      local_50.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (local_50.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi + 1);
      iVar1 = this->id_;
      _Var2 = (this->leader_).super___atomic_base<int>._M_i;
      local_50.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _M_use_count = (int)_Var5;
      local_50.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _M_weak_count = (int)(_Var5 >> 0x20);
      *(undefined4 *)
       &local_50.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        [2]._vptr__Sp_counted_base = 0x1a;
      *(int32 *)((long)&local_50.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi[2]._vptr__Sp_counted_base + 4) = iVar1;
      local_50.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
      _M_use_count = _Var2;
      local_50.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _vptr__Sp_counted_base = (_func_int **)&PTR__req_msg_005c4540;
      local_50.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
      _vptr__Sp_counted_base = (_func_int **)0x0;
      local_50.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
      _M_use_count = 0;
      local_50.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
      _M_weak_count = 0;
      local_50.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
      _vptr__Sp_counted_base = (_func_int **)0x0;
      local_50.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
      _M_use_count = 0;
      local_50.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
      _M_weak_count = 0;
      local_50.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
      _vptr__Sp_counted_base = (_func_int **)0x0;
      local_50.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
      _M_use_count = 0;
      local_50.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
      _M_weak_count = 0;
      LOCK();
      bVar8 = (this_00->busy_flag_)._M_base._M_i == false;
      if (bVar8) {
        (this_00->busy_flag_)._M_base._M_i = true;
      }
      UNLOCK();
      if (bVar8) {
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_01->_M_use_count = this_01->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_01->_M_use_count = this_01->_M_use_count + 1;
          }
        }
        local_40.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
        local_40.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             this_01;
        peer::send_req(this_00,&local_40,&local_50,&this->ex_resp_handler_);
        if (local_40.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_40.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      else {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar3 != (element_type *)0x0) && (iVar6 = (*peVar3->_vptr_logger[7])(), 1 < iVar6)) {
          peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_70,"previous message to leader %d hasn\'t been responded yet",
                     (ulong)(uint)((this_00->config_).
                                   super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->id_);
          (*peVar3->_vptr_logger[8])
                    (peVar3,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"send_reconnect_request",0x394,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_70._M_dataplus._M_p._4_4_,
                          (__int_type_conflict)local_70._M_dataplus._M_p) != &local_70.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_70._M_dataplus._M_p._4_4_,
                                     (__int_type_conflict)local_70._M_dataplus._M_p));
          }
        }
      }
      if (local_50.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  return;
}

Assistant:

void raft_server::send_reconnect_request() {
    recur_lock(lock_);

    if (leader_ == id_) {
        p_er("this node %d is leader, "
             "cannot send reconnect request",
             id_);
        return;
    }

    // Find leader object.
    auto entry = peers_.find(leader_);
    if (entry != peers_.end()) {
        ptr<peer> p_leader = entry->second;
        ptr<req_msg> req = cs_new<req_msg>( state_->get_term(),
                                            msg_type::reconnect_request,
                                            id_,
                                            leader_,
                                            0, 0, 0 );

        if (p_leader->make_busy()) {
            p_leader->send_req(p_leader, req, ex_resp_handler_);
        } else {
            p_er("previous message to leader %d hasn't been responded yet",
                 p_leader->get_id());
        }

    } else {
        // LCOV_EXCL_START
        p_ft("cannot find leader!");
        ctx_->state_mgr_->system_exit(N22_unrecoverable_isolation);
        // LCOV_EXCL_STOP
    }
}